

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_collectargs(ASMState *as,IRIns *ir,CCallInfo *ci,IRRef *args)

{
  uint local_2c;
  uint local_28;
  uint32_t n;
  IRRef *args_local;
  CCallInfo *ci_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  n = ci->flags & 0xff;
  ir_local = ir;
  args_local = args;
  if ((ci->flags & 0x100) != 0) {
    args_local = args + 1;
    *args = 0x7fff;
    n = n - 1;
  }
  while (1 < n) {
    ir_local = as->ir + (ir_local->field_0).op1;
    if ((ir_local->field_0).op2 == 0x7fff) {
      local_28 = 0;
    }
    else {
      local_28 = (uint)(ir_local->field_0).op2;
    }
    args_local[n - 1] = local_28;
    n = n - 1;
  }
  if ((ir_local->field_0).op1 == 0x7fff) {
    local_2c = 0;
  }
  else {
    local_2c = (uint)(ir_local->field_0).op1;
  }
  *args_local = local_2c;
  return;
}

Assistant:

static void asm_collectargs(ASMState *as, IRIns *ir,
			    const CCallInfo *ci, IRRef *args)
{
  uint32_t n = CCI_NARGS(ci);
  lua_assert(n <= CCI_NARGS_MAX*2);  /* Account for split args. */
  if ((ci->flags & CCI_L)) { *args++ = ASMREF_L; n--; }
  while (n-- > 1) {
    ir = IR(ir->op1);
    lua_assert(ir->o == IR_CARG);
    args[n] = ir->op2 == REF_NIL ? 0 : ir->op2;
  }
  args[0] = ir->op1 == REF_NIL ? 0 : ir->op1;
  lua_assert(IR(ir->op1)->o != IR_CARG);
}